

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O1

int jpc_getuint32(jas_stream_t *in,uint_fast32_t *val)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  uVar2 = 0xffffffff;
  if ((in->flags_ & 7U) == 0) {
    if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
      iVar6 = in->cnt_;
      in->cnt_ = iVar6 + -1;
      if (iVar6 < 1) {
        uVar2 = jas_stream_fillbuf(in,1);
      }
      else {
        in->rwcnt_ = in->rwcnt_ + 1;
        pbVar1 = in->ptr_;
        in->ptr_ = pbVar1 + 1;
        uVar2 = (uint)*pbVar1;
      }
    }
    else {
      in->flags_ = in->flags_ | 4;
    }
  }
  iVar6 = -1;
  if (uVar2 != 0xffffffff) {
    uVar3 = 0xffffffff;
    if ((in->flags_ & 7U) == 0) {
      if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
        iVar6 = in->cnt_;
        in->cnt_ = iVar6 + -1;
        if (iVar6 < 1) {
          uVar3 = jas_stream_fillbuf(in,1);
        }
        else {
          in->rwcnt_ = in->rwcnt_ + 1;
          pbVar1 = in->ptr_;
          in->ptr_ = pbVar1 + 1;
          uVar3 = (uint)*pbVar1;
        }
      }
      else {
        in->flags_ = in->flags_ | 4;
      }
    }
    iVar6 = -1;
    if (uVar3 != 0xffffffff) {
      uVar4 = 0xffffffff;
      if ((in->flags_ & 7U) == 0) {
        if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
          iVar6 = in->cnt_;
          in->cnt_ = iVar6 + -1;
          if (iVar6 < 1) {
            uVar4 = jas_stream_fillbuf(in,1);
          }
          else {
            in->rwcnt_ = in->rwcnt_ + 1;
            pbVar1 = in->ptr_;
            in->ptr_ = pbVar1 + 1;
            uVar4 = (uint)*pbVar1;
          }
        }
        else {
          in->flags_ = in->flags_ | 4;
        }
      }
      iVar6 = -1;
      if (uVar4 != 0xffffffff) {
        uVar5 = 0xffffffff;
        if ((in->flags_ & 7U) == 0) {
          if ((in->rwlimit_ < 0) || (in->rwcnt_ < in->rwlimit_)) {
            iVar6 = in->cnt_;
            in->cnt_ = iVar6 + -1;
            if (iVar6 < 1) {
              uVar5 = jas_stream_fillbuf(in,1);
            }
            else {
              in->rwcnt_ = in->rwcnt_ + 1;
              pbVar1 = in->ptr_;
              in->ptr_ = pbVar1 + 1;
              uVar5 = (uint)*pbVar1;
            }
          }
          else {
            in->flags_ = in->flags_ | 4;
            uVar5 = 0xffffffff;
          }
        }
        iVar6 = -1;
        if (uVar5 != 0xffffffff) {
          iVar6 = 0;
          if (val != (uint_fast32_t *)0x0) {
            *val = (long)(int)uVar5 |
                   ((long)(int)uVar4 | (long)(int)uVar3 << 8 | (long)(int)uVar2 << 0x10) << 8;
            iVar6 = 0;
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int jpc_getuint32(jas_stream_t *in, uint_fast32_t *val)
{
	uint_fast32_t v;
	int c;
	if ((c = jas_stream_getc(in)) == EOF) {
		return -1;
	}
	v = c;
	if ((c = jas_stream_getc(in)) == EOF) {
		return -1;
	}
	v = (v << 8) | c;
	if ((c = jas_stream_getc(in)) == EOF) {
		return -1;
	}
	v = (v << 8) | c;
	if ((c = jas_stream_getc(in)) == EOF) {
		return -1;
	}
	v = (v << 8) | c;
	if (val) {
		*val = v;
	}
	return 0;
}